

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O3

void array_suite::test_string(void)

{
  long lVar1;
  long *plVar2;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> value;
  value_type input [11];
  iarchive in;
  undefined1 local_108 [32];
  _Alloc_hider local_e8 [2];
  long local_d8 [2];
  uchar local_c8 [16];
  iarchive local_b8;
  
  local_c8[0] = 0x92;
  local_c8[1] = '\x02';
  local_c8[2] = 0xa9;
  local_c8[3] = '\x02';
  local_c8[4] = 'A';
  local_c8[5] = 'B';
  local_c8[6] = 0xa9;
  local_c8[7] = '\x02';
  local_c8[8] = 'C';
  local_c8[9] = 'D';
  local_c8[10] = 0x93;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[11]>
            (&local_b8,(uchar (*) [11])local_c8);
  local_108._0_8_ = local_108 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"");
  plVar2 = local_d8;
  local_e8[0]._M_p = (pointer)plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"");
  trial::protocol::serialization::
  load_overloader<trial::protocol::bintoken::iarchive,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_void>
  ::load(&local_b8,
         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *)local_108,0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("value[0]","\"AB\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x33,"void array_suite::test_string()",local_108,"AB");
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("value[1]","\"CD\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x34,"void array_suite::test_string()",(string *)local_e8,"CD");
  lVar1 = -0x40;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  local_b8.super_common_iarchive<trial::protocol::bintoken::iarchive>._0_8_ = &PTR_vload_0012b7c8;
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)((long)&local_b8 + 0x50));
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&local_b8);
  return;
}

Assistant:

void test_string()
{
    const value_type input[] = { token::code::begin_array,
                                 0x02,
                                 token::code::string8, 0x02, 0x41, 0x42,
                                 token::code::string8, 0x02, 0x43, 0x44,
                                 token::code::end_array };
    format::iarchive in(input);
    std::array<std::string, 2> value = {{ "", "" }};
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], "AB");
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], "CD");
}